

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int cm_zlib_inflateSync(z_streamp strm)

{
  internal_state *piVar1;
  uLong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uLong uVar8;
  uchar buf [4];
  uchar local_34 [4];
  
  iVar3 = inflateStateCheck(strm);
  iVar7 = -2;
  if (iVar3 == 0) {
    piVar1 = strm->state;
    uVar4 = strm->avail_in;
    if ((uVar4 != 0) || (iVar7 = -5, 7 < piVar1->w_mask)) {
      if (piVar1->status != 0x3f53) {
        piVar1->status = 0x3f53;
        uVar4 = piVar1->w_mask;
        lVar6._0_4_ = piVar1->w_size;
        lVar6._4_4_ = piVar1->w_bits;
        uVar5 = lVar6 << ((byte)uVar4 & 7);
        piVar1->w_size = (int)uVar5;
        piVar1->w_bits = (int)(uVar5 >> 0x20);
        lVar6 = 0;
        if ((uVar4 & 0xfffffff8) != 0) {
          iVar3 = -(uVar4 & 0xfffffff8);
          lVar6 = 0;
          do {
            local_34[lVar6] = (uchar)uVar5;
            lVar6 = lVar6 + 1;
            uVar5 = uVar5 >> 8;
            iVar3 = iVar3 + 8;
          } while (iVar3 != 0);
          piVar1->w_size = (int)uVar5;
          piVar1->w_bits = (int)(uVar5 >> 0x20);
        }
        piVar1->w_mask = 0;
        piVar1->hash_mask = 0;
        syncsearch(&piVar1->hash_mask,local_34,(uint)lVar6);
        uVar4 = strm->avail_in;
      }
      uVar4 = syncsearch(&piVar1->hash_mask,strm->next_in,uVar4);
      strm->avail_in = strm->avail_in - uVar4;
      strm->next_in = strm->next_in + uVar4;
      uVar8 = (ulong)uVar4 + strm->total_in;
      strm->total_in = uVar8;
      iVar7 = -3;
      if (piVar1->hash_mask == 4) {
        iVar3 = (int)piVar1->pending_buf_size;
        iVar7 = 0;
        uVar4 = 0;
        if (iVar3 != -1) {
          uVar4 = *(uint *)&piVar1->pending_buf & 0xfffffffb;
        }
        *(uint *)&piVar1->pending_buf = uVar4;
        uVar2 = strm->total_out;
        cm_zlib_inflateReset(strm);
        strm->total_in = uVar8;
        strm->total_out = uVar2;
        *(int *)&piVar1->pending_buf_size = iVar3;
        piVar1->status = 0x3f3f;
      }
    }
  }
  return iVar7;
}

Assistant:

int ZEXPORT inflateSync(strm)
z_streamp strm;
{
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned long in, out;      /* temporary to save total_in and total_out */
    unsigned char buf[4];       /* to restore bit buffer to byte string */
    struct inflate_state FAR *state;

    /* check parameters */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8) return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold <<= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4) return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;  out = strm->total_out;
    inflateReset(strm);
    strm->total_in = in;  strm->total_out = out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}